

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotStemsEx<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>>
               (char *label_id,GetterXsYs<long_long> *get_mark,GetterXsYRef<long_long> *get_base)

{
  double dVar1;
  ImVec2 IVar2;
  bool bVar3;
  TransformerLogLog transformer;
  int iVar4;
  ImPlotPlot *pIVar5;
  double dVar6;
  bool bVar7;
  ImU32 IVar8;
  ImU32 col_mk_fill;
  long lVar9;
  ImDrawList *DrawList;
  ImPlotContext *pIVar10;
  int iVar11;
  longlong *plVar12;
  longlong *plVar13;
  ulong uVar14;
  int iVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  ImPlotPoint local_90;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  longlong *local_60;
  longlong *local_58;
  ImPlotContext *local_50;
  longlong *local_48;
  undefined8 uStack_40;
  
  bVar7 = BeginItem(label_id,0);
  if (bVar7) {
    if ((GImPlot->FitThisFrame == true) && (0 < get_base->Count)) {
      iVar11 = 0;
      do {
        iVar15 = get_mark->Count;
        lVar9 = (long)(((get_mark->Offset + iVar11) % iVar15 + iVar15) % iVar15) *
                (long)get_mark->Stride;
        local_90.x = (double)*(long *)((long)get_mark->Xs + lVar9);
        local_90.y = (double)*(long *)((long)get_mark->Ys + lVar9);
        FitPoint(&local_90);
        iVar15 = get_base->Count;
        local_90.x = (double)*(long *)((long)get_base->Xs +
                                      (long)(((get_base->Offset + iVar11) % iVar15 + iVar15) %
                                            iVar15) * (long)get_base->Stride);
        local_90.y = get_base->YRef;
        FitPoint(&local_90);
        iVar11 = iVar11 + 1;
      } while (iVar11 < get_base->Count);
    }
    pIVar10 = GImPlot;
    DrawList = GetPlotDrawList();
    if ((pIVar10->NextItemData).RenderLine == true) {
      IVar8 = ImGui::GetColorU32((pIVar10->NextItemData).Colors);
      iVar11 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar11]) {
      case 0:
        local_90.x = (double)CONCAT44(local_90.x._4_4_,iVar11);
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLinLin>
                  (get_mark,get_base,(TransformerLinLin *)&local_90,DrawList,
                   (pIVar10->NextItemData).LineWeight,IVar8);
        break;
      case 1:
        local_90.x = (double)CONCAT44(local_90.x._4_4_,iVar11);
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLin>
                  (get_mark,get_base,(TransformerLogLin *)&local_90,DrawList,
                   (pIVar10->NextItemData).LineWeight,IVar8);
        break;
      case 2:
        local_90.x = (double)CONCAT44(local_90.x._4_4_,iVar11);
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLinLog>
                  (get_mark,get_base,(TransformerLinLog *)&local_90,DrawList,
                   (pIVar10->NextItemData).LineWeight,IVar8);
        break;
      case 3:
        local_90.x = (double)CONCAT44(local_90.x._4_4_,iVar11);
        RenderLineSegments<ImPlot::GetterXsYs<long_long>,ImPlot::GetterXsYRef<long_long>,ImPlot::TransformerLogLog>
                  (get_mark,get_base,(TransformerLogLog *)&local_90,DrawList,
                   (pIVar10->NextItemData).LineWeight,IVar8);
      }
    }
    iVar11 = (pIVar10->NextItemData).Marker;
    iVar15 = 0;
    if (iVar11 != -1) {
      iVar15 = iVar11;
    }
    IVar8 = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 2);
    col_mk_fill = ImGui::GetColorU32((pIVar10->NextItemData).Colors + 3);
    transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
    local_50 = GImPlot;
    switch(GImPlot->Scales[transformer.YAxis]) {
    case 0:
      iVar11 = get_mark->Count;
      if (0 < iVar11) {
        plVar12 = get_mark->Xs;
        plVar13 = get_mark->Ys;
        uVar14 = (ulong)(uint)get_mark->Offset;
        local_60 = (longlong *)CONCAT44(local_60._4_4_,(pIVar10->NextItemData).MarkerSize);
        local_68 = CONCAT44(local_68._4_4_,(pIVar10->NextItemData).MarkerWeight);
        iVar4 = get_mark->Stride;
        local_70 = (long)iVar15;
        iVar15 = 0;
        bVar7 = (pIVar10->NextItemData).RenderMarkerLine;
        local_80 = CONCAT44(local_80._4_4_,(uint)(pIVar10->NextItemData).RenderMarkerFill);
        pIVar10 = GImPlot;
        local_78 = uVar14;
        local_58 = plVar12;
        local_48 = plVar13;
        do {
          lVar9 = (long)((((int)uVar14 + iVar15) % iVar11 + iVar11) % iVar11) * (long)iVar4;
          IVar2 = pIVar10->PixelRange[transformer.YAxis].Min;
          fVar16 = (float)(pIVar10->Mx *
                           ((double)*(long *)((long)plVar12 + lVar9) -
                           (pIVar10->CurrentPlot->XAxis).Range.Min) + (double)IVar2.x);
          fVar17 = (float)(pIVar10->My[transformer.YAxis] *
                           ((double)*(long *)((long)plVar13 + lVar9) -
                           pIVar10->CurrentPlot->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar2.y);
          local_90.x = (double)CONCAT44(fVar17,fVar16);
          pIVar5 = local_50->CurrentPlot;
          if ((((pIVar5->PlotRect).Min.x <= fVar16) && ((pIVar5->PlotRect).Min.y <= fVar17)) &&
             ((fVar16 < (pIVar5->PlotRect).Max.x && (fVar17 < (pIVar5->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<long_long>>(ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_70 * 8))
                      (local_60._0_4_,(undefined4)local_68,DrawList,&local_90,bVar7,IVar8,
                       local_80 & 0xffffffff,col_mk_fill);
            pIVar10 = GImPlot;
            plVar12 = local_58;
            plVar13 = local_48;
            uVar14 = local_78;
          }
          iVar15 = iVar15 + 1;
        } while (iVar11 != iVar15);
      }
      break;
    case 1:
      iVar11 = get_mark->Count;
      if (0 < iVar11) {
        local_58 = get_mark->Xs;
        local_60 = get_mark->Ys;
        local_68 = (ulong)(uint)get_mark->Offset;
        local_78 = CONCAT44(local_78._4_4_,(pIVar10->NextItemData).MarkerSize);
        fVar16 = (pIVar10->NextItemData).MarkerWeight;
        local_70 = (long)get_mark->Stride;
        local_80 = (ulong)iVar15;
        iVar15 = 0;
        bVar7 = (pIVar10->NextItemData).RenderMarkerLine;
        bVar3 = (pIVar10->NextItemData).RenderMarkerFill;
        do {
          pIVar10 = GImPlot;
          lVar9 = ((((int)local_68 + iVar15) % iVar11 + iVar11) % iVar11) * local_70;
          local_48 = (longlong *)(double)*(long *)((long)local_60 + lVar9);
          uStack_40 = 0;
          dVar1 = log10((double)*(long *)((long)local_58 + lVar9) /
                        (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar5 = pIVar10->CurrentPlot;
          dVar6 = (pIVar5->XAxis).Range.Min;
          IVar2 = pIVar10->PixelRange[transformer.YAxis].Min;
          fVar17 = (float)(pIVar10->Mx *
                           (((double)(float)(dVar1 / pIVar10->LogDenX) *
                             ((pIVar5->XAxis).Range.Max - dVar6) + dVar6) - dVar6) + (double)IVar2.x
                          );
          fVar18 = (float)(pIVar10->My[transformer.YAxis] *
                           ((double)local_48 - pIVar5->YAxis[transformer.YAxis].Range.Min) +
                          (double)IVar2.y);
          local_90.x = (double)CONCAT44(fVar18,fVar17);
          pIVar5 = local_50->CurrentPlot;
          if ((((pIVar5->PlotRect).Min.x <= fVar17) && ((pIVar5->PlotRect).Min.y <= fVar18)) &&
             ((fVar17 < (pIVar5->PlotRect).Max.x && (fVar18 < (pIVar5->PlotRect).Max.y)))) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<long_long>>(ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_80 * 8))
                      ((undefined4)local_78,fVar16,DrawList,&local_90,bVar7,IVar8,bVar3,col_mk_fill)
            ;
          }
          iVar15 = iVar15 + 1;
        } while (iVar11 != iVar15);
      }
      break;
    case 2:
      iVar11 = get_mark->Count;
      if (0 < iVar11) {
        local_58 = get_mark->Xs;
        local_60 = get_mark->Ys;
        local_68 = (ulong)(uint)get_mark->Offset;
        local_78 = CONCAT44(local_78._4_4_,(pIVar10->NextItemData).MarkerSize);
        fVar16 = (pIVar10->NextItemData).MarkerWeight;
        local_70 = (long)get_mark->Stride;
        local_80 = (ulong)iVar15;
        iVar15 = 0;
        bVar7 = (pIVar10->NextItemData).RenderMarkerLine;
        bVar3 = (pIVar10->NextItemData).RenderMarkerFill;
        do {
          pIVar10 = GImPlot;
          lVar9 = ((((int)local_68 + iVar15) % iVar11 + iVar11) % iVar11) * local_70;
          local_48 = (longlong *)(double)*(long *)((long)local_58 + lVar9);
          uStack_40 = 0;
          dVar6 = log10((double)*(long *)((long)local_60 + lVar9) /
                        GImPlot->CurrentPlot->YAxis[transformer.YAxis].Range.Min);
          pIVar5 = pIVar10->CurrentPlot;
          dVar1 = pIVar5->YAxis[transformer.YAxis].Range.Min;
          IVar2 = pIVar10->PixelRange[transformer.YAxis].Min;
          fVar17 = (float)(pIVar10->Mx * ((double)local_48 - (pIVar5->XAxis).Range.Min) +
                          (double)IVar2.x);
          fVar18 = (float)(pIVar10->My[transformer.YAxis] *
                           (((double)(float)(dVar6 / pIVar10->LogDenY[transformer.YAxis]) *
                             (pIVar5->YAxis[transformer.YAxis].Range.Max - dVar1) + dVar1) - dVar1)
                          + (double)IVar2.y);
          local_90.x = (double)CONCAT44(fVar18,fVar17);
          pIVar5 = local_50->CurrentPlot;
          if (((((pIVar5->PlotRect).Min.x <= fVar17) && ((pIVar5->PlotRect).Min.y <= fVar18)) &&
              (fVar17 < (pIVar5->PlotRect).Max.x)) && (fVar18 < (pIVar5->PlotRect).Max.y)) {
            (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<long_long>>(ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                         ::marker_table + local_80 * 8))
                      ((undefined4)local_78,fVar16,DrawList,&local_90,bVar7,IVar8,bVar3,col_mk_fill)
            ;
          }
          iVar15 = iVar15 + 1;
        } while (iVar11 != iVar15);
      }
      break;
    case 3:
      RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<long_long>>
                (*get_mark,transformer,DrawList,iVar15,(pIVar10->NextItemData).MarkerSize,
                 (pIVar10->NextItemData).RenderMarkerLine,IVar8,(pIVar10->NextItemData).MarkerWeight
                 ,(pIVar10->NextItemData).RenderMarkerFill,col_mk_fill);
    }
    pIVar10 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar10->NextItemData);
    pIVar10->PreviousItem = pIVar10->CurrentItem;
    pIVar10->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStemsEx(const char* label_id, const GetterM& get_mark, const GetterB& get_base) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < get_base.Count; ++i) {
                FitPoint(get_mark(i));
                FitPoint(get_base(i));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_mark, get_base, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_mark, get_base, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_mark, get_base, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_mark, get_base, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        ImPlotMarker marker = s.Marker == ImPlotMarker_None ? ImPlotMarker_Circle : s.Marker;
        if (marker != ImPlotMarker_None) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(get_mark, TransformerLinLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(get_mark, TransformerLogLin(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(get_mark, TransformerLinLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(get_mark, TransformerLogLog(), DrawList, marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}